

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O2

void create_file(char *name)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_1d0;
  uv_fs_t req;
  
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&req,name,0x41,0x180,(uv_fs_cb)0x0);
  if (iVar1 < 0) {
    pcVar2 = "r >= 0";
    uStack_1d0 = 0x5b;
  }
  else {
    uv_fs_req_cleanup(&req);
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&req,iVar1,(uv_fs_cb)0x0);
    if (iVar1 == 0) {
      uv_fs_req_cleanup(&req);
      return;
    }
    pcVar2 = "r == 0";
    uStack_1d0 = 0x5f;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-event.c"
          ,uStack_1d0,pcVar2);
  abort();
}

Assistant:

static void create_file(const char* name) {
  int r;
  uv_file file;
  uv_fs_t req;

  r = uv_fs_open(NULL, &req, name, O_WRONLY | O_CREAT, S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  file = r;
  uv_fs_req_cleanup(&req);
  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&req);
}